

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::MergeFromInternal(MapEntryImpl<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                    *this,MapEntryImpl<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                          *from)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  Argument *pAVar4;
  undefined4 extraout_var_00;
  Arena *pAVar5;
  undefined8 *puVar6;
  
  uVar3 = from->_has_bits_[0];
  if (uVar3 != 0) {
    if ((uVar3 & 1) != 0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar6 = (undefined8 *)*puVar6;
      }
      ArenaStringPtr::Mutable_abi_cxx11_(&this->key_,puVar6);
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0xd])(from);
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      ArenaStringPtr::Set(&this->key_,(string *)&fixed_address_empty_string_abi_cxx11_,
                          (ConstStringParam)CONCAT44(extraout_var,iVar2),pAVar5);
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 2) != 0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      if (this->value_ == (ValueOnMemory)0x0) {
        pAVar4 = Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Argument>(pAVar5);
        this->value_ = pAVar4;
      }
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0xe])(from);
      CoreML::Specification::MILSpec::Argument::MergeFrom
                (this->value_,(Argument *)CONCAT44(extraout_var_00,iVar2));
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
    }
  }
  return;
}

Assistant:

void MergeFromInternal(const MapEntryImpl& from) {
    if (from._has_bits_[0]) {
      if (from.has_key()) {
        KeyTypeHandler::EnsureMutable(&key_, Base::GetArenaForAllocation());
        KeyTypeHandler::Merge(from.key(), &key_, Base::GetArenaForAllocation());
        set_has_key();
      }
      if (from.has_value()) {
        ValueTypeHandler::EnsureMutable(&value_, Base::GetArenaForAllocation());
        ValueTypeHandler::Merge(from.value(), &value_,
                                Base::GetArenaForAllocation());
        set_has_value();
      }
    }
  }